

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::RE2FullMatchAnchored(void)

{
  bool bVar1;
  int i;
  Arg *args [1];
  int local_1dc;
  Arg *local_1d8;
  Arg local_1d0;
  StringPiece local_1c0;
  LogMessage local_1b0;
  
  RE2::RE2((RE2 *)&local_1b0,"(\\d+)");
  local_1d0.parser_ = RE2::Arg::parse_int;
  local_1c0.ptr_ = "x1001";
  local_1c0.length_ = 5;
  local_1d8 = &local_1d0;
  local_1d0.arg_ = &local_1dc;
  bVar1 = RE2::FullMatchN(&local_1c0,(RE2 *)&local_1b0,&local_1d8,1);
  RE2::~RE2((RE2 *)&local_1b0);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x390,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,
               "Check failed: !RE2::FullMatch(\"x1001\", \"(\\\\d+)\", &i)",0x34);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  RE2::RE2((RE2 *)&local_1b0,"(\\d+)");
  local_1d0.parser_ = RE2::Arg::parse_int;
  local_1c0.ptr_ = "1001x";
  local_1c0.length_ = 5;
  local_1d8 = &local_1d0;
  local_1d0.arg_ = &local_1dc;
  bVar1 = RE2::FullMatchN(&local_1c0,(RE2 *)&local_1b0,&local_1d8,1);
  RE2::~RE2((RE2 *)&local_1b0);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x391,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,
               "Check failed: !RE2::FullMatch(\"1001x\", \"(\\\\d+)\", &i)",0x34);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  RE2::RE2((RE2 *)&local_1b0,"x(\\d+)");
  local_1d0.parser_ = RE2::Arg::parse_int;
  local_1c0.ptr_ = "x1001";
  local_1c0.length_ = 5;
  local_1d8 = &local_1d0;
  local_1d0.arg_ = &local_1dc;
  bVar1 = RE2::FullMatchN(&local_1c0,(RE2 *)&local_1b0,&local_1d8,1);
  RE2::~RE2((RE2 *)&local_1b0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x392,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,
               "Check failed: RE2::FullMatch(\"x1001\", \"x(\\\\d+)\", &i)",0x34);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  if (local_1dc != 0x3e9) {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x392,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,"Check failed: (i) == (1001)",0x1b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  RE2::RE2((RE2 *)&local_1b0,"(\\d+)x");
  local_1d0.parser_ = RE2::Arg::parse_int;
  local_1c0.ptr_ = "1001x";
  local_1c0.length_ = 5;
  local_1d8 = &local_1d0;
  local_1d0.arg_ = &local_1dc;
  bVar1 = RE2::FullMatchN(&local_1c0,(RE2 *)&local_1b0,&local_1d8,1);
  RE2::~RE2((RE2 *)&local_1b0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x393,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,
               "Check failed: RE2::FullMatch(\"1001x\", \"(\\\\d+)x\", &i)",0x34);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  if (local_1dc != 0x3e9) {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x393,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,"Check failed: (i) == (1001)",0x1b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  return;
}

Assistant:

TEST(RE2, FullMatchAnchored) {
  int i;
  // Check that matching is fully anchored
  CHECK(!RE2::FullMatch("x1001", "(\\d+)",  &i));
  CHECK(!RE2::FullMatch("1001x", "(\\d+)",  &i));
  CHECK(RE2::FullMatch("x1001",  "x(\\d+)", &i)); CHECK_EQ(i, 1001);
  CHECK(RE2::FullMatch("1001x",  "(\\d+)x", &i)); CHECK_EQ(i, 1001);
}